

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxIdentifier::Resolve(FxIdentifier *this,FCompileContext *ctx)

{
  PStruct *classctx;
  PSymbol *pPVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  FxStaticArrayVariable *this_00;
  undefined4 extraout_var;
  FxLocalVariable *this_01;
  undefined4 extraout_var_00;
  FxStackVariable *this_02;
  undefined4 extraout_var_01;
  FxClassDefaults *this_03;
  FxExpression *pFVar5;
  undefined4 extraout_var_02;
  Variant *pVVar6;
  FxSelf *pFVar7;
  undefined4 extraout_var_03;
  char *pcVar8;
  FScriptPosition *pFVar9;
  FxGlobalVariable *pFVar10;
  FBaseCVar *this_04;
  undefined4 extraout_var_04;
  FName *name;
  PClass *pPVar11;
  size_t sVar12;
  FxExpression *local_180;
  FBaseCVar *cvar;
  FxSelf *local_a0;
  FxExpression *self_1;
  FxSelf *local_90;
  FxExpression *self;
  PSymbolTable *local_80;
  PSymbolTable *symtbl;
  FxExpression *x_3;
  FxStackVariable *x_2;
  FxLocalVariable *x_1;
  FxStaticArrayVariable *local_50;
  FxStaticArrayVariable *x;
  FxLocalVariableDeclaration *local_40;
  FxLocalVariableDeclaration *local;
  FxGlobalVariable *pFStack_30;
  int num;
  FxExpression *newex;
  PSymbol *sym;
  FCompileContext *ctx_local;
  FxIdentifier *this_local;
  
  pFStack_30 = (FxGlobalVariable *)0x0;
  if (((this->super_FxExpression).isresolved & 1U) != 0) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  sym = (PSymbol *)ctx;
  ctx_local = (FCompileContext *)this;
  FName::FName((FName *)((long)&x + 4),&this->Identifier);
  name = (FName *)((long)&x + 4);
  local_40 = FCompileContext::FindLocalVariable(ctx,name);
  if (local_40 != (FxLocalVariableDeclaration *)0x0) {
    if ((local_40->super_FxExpression).ExprType == EFX_StaticArray) {
      this_00 = (FxStaticArrayVariable *)
                FxExpression::operator_new((FxExpression *)0x38,(size_t)name);
      FxStaticArrayVariable::FxStaticArrayVariable
                (this_00,local_40,&(this->super_FxExpression).ScriptPosition);
      local_50 = this_00;
      if (this != (FxIdentifier *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      iVar3 = (*(local_50->super_FxExpression)._vptr_FxExpression[2])(local_50,sym);
      return (FxExpression *)CONCAT44(extraout_var,iVar3);
    }
    iVar3 = PType::GetRegType((local_40->super_FxExpression).ValueType);
    if (iVar3 != 0x80) {
      this_01 = (FxLocalVariable *)FxExpression::operator_new((FxExpression *)0x38,(size_t)name);
      FxLocalVariable::FxLocalVariable(this_01,local_40,&(this->super_FxExpression).ScriptPosition);
      x_2 = (FxStackVariable *)this_01;
      if (this != (FxIdentifier *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      iVar3 = (*(x_2->super_FxExpression)._vptr_FxExpression[2])(x_2,sym);
      return (FxExpression *)CONCAT44(extraout_var_00,iVar3);
    }
    this_02 = (FxStackVariable *)FxExpression::operator_new((FxExpression *)0x38,(size_t)name);
    FxStackVariable::FxStackVariable
              (this_02,(local_40->super_FxExpression).ValueType,local_40->StackOffset,
               &(this->super_FxExpression).ScriptPosition);
    x_3 = (FxExpression *)this_02;
    if (this != (FxIdentifier *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    iVar3 = (*x_3->_vptr_FxExpression[2])(x_3,sym);
    return (FxExpression *)CONCAT44(extraout_var_01,iVar3);
  }
  bVar2 = FName::operator==(&this->Identifier,NAME_Default);
  pPVar1 = sym;
  if (bVar2) {
    pVVar6 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                       ((TArray<PFunction::Variant,_PFunction::Variant> *)
                        (*(long *)&(sym->super_PTypeBase).super_DObject.ObjectFlags + 0x28),0);
    if (pVVar6->SelfClass == (PStruct *)0x0) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "Unable to access class defaults from static function");
      if (this != (FxIdentifier *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      return (FxExpression *)0x0;
    }
    pVVar6 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                       ((TArray<PFunction::Variant,_PFunction::Variant> *)
                        (*(long *)&(sym->super_PTypeBase).super_DObject.ObjectFlags + 0x28),0);
    pPVar11 = PClassActor::RegistrationInfo.MyClass;
    bVar2 = DObject::IsKindOf((DObject *)pVVar6->SelfClass,PClassActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"\'Default\' requires an actor type.")
      ;
      if (this != (FxIdentifier *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      return (FxExpression *)0x0;
    }
    this_03 = (FxClassDefaults *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar11);
    pFVar7 = (FxSelf *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pPVar11);
    FxSelf::FxSelf(pFVar7,&(this->super_FxExpression).ScriptPosition,false);
    FxClassDefaults::FxClassDefaults
              (this_03,(FxExpression *)pFVar7,&(this->super_FxExpression).ScriptPosition);
    symtbl = (PSymbolTable *)this_03;
    if (this != (FxIdentifier *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    pFVar5 = (FxExpression *)(*(code *)(symtbl->ParentSymbolTable->Symbols).LastFree)(symtbl,sym);
    return pFVar5;
  }
  FName::FName((FName *)((long)&self + 4),&this->Identifier);
  newex = (FxExpression *)
          FCompileContext::FindInSelfClass
                    ((FCompileContext *)pPVar1,(FName *)((long)&self + 4),&local_80);
  if ((newex == (FxExpression *)0x0) ||
     (pPVar11 = PField::RegistrationInfo.MyClass,
     bVar2 = DObject::IsKindOf((DObject *)newex,PField::RegistrationInfo.MyClass), !bVar2)) {
    pPVar1 = sym;
    if (pFStack_30 == (FxGlobalVariable *)0x0) {
      FName::FName((FName *)((long)&self_1 + 4),&this->Identifier);
      newex = (FxExpression *)
              FCompileContext::FindInClass
                        ((FCompileContext *)pPVar1,(FName *)((long)&self_1 + 4),&local_80);
      if (newex != (FxExpression *)0x0) {
        bVar2 = DObject::IsKindOf((DObject *)newex,PSymbolConst::RegistrationInfo.MyClass);
        if (bVar2) {
          pcVar8 = FName::GetChars(&this->Identifier);
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,8,
                     "Resolving name \'%s\' as class constant\n",pcVar8);
          pFStack_30 = (FxGlobalVariable *)
                       FxConstant::MakeConstant
                                 ((PSymbol *)newex,&(this->super_FxExpression).ScriptPosition);
        }
        else {
          pVVar6 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                             ((TArray<PFunction::Variant,_PFunction::Variant> *)
                              (*(long *)&(sym->super_PTypeBase).super_DObject.ObjectFlags + 0x28),0)
          ;
          if ((pVVar6->SelfClass == (PStruct *)sym[1].super_PTypeBase.super_DObject._vptr_DObject)
             || (pPVar11 = PField::RegistrationInfo.MyClass,
                bVar2 = DObject::IsKindOf((DObject *)newex,PField::RegistrationInfo.MyClass), !bVar2
                )) {
            bVar2 = DObject::IsKindOf((DObject *)newex,PFunction::RegistrationInfo.MyClass);
            if (bVar2) {
              pcVar8 = FName::GetChars(&this->Identifier);
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,2,
                         "Function \'%s\' used without ().\n",pcVar8);
            }
            else {
              pcVar8 = FName::GetChars(&this->Identifier);
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,2,
                         "Invalid member identifier \'%s\'.\n",pcVar8);
            }
            if (this != (FxIdentifier *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
          pFVar7 = (FxSelf *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pPVar11);
          FxSelf::FxSelf(pFVar7,&(this->super_FxExpression).ScriptPosition,true);
          local_a0 = pFVar7;
          iVar3 = (*(pFVar7->super_FxExpression)._vptr_FxExpression[2])(pFVar7,sym);
          local_a0 = (FxSelf *)CONCAT44(extraout_var_03,iVar3);
          pFStack_30 = (FxGlobalVariable *)
                       ResolveMember(this,(FCompileContext *)sym,
                                     (PStruct *)sym[1].super_PTypeBase.super_DObject._vptr_DObject,
                                     (FxExpression **)&local_a0,
                                     (PStruct *)sym[1].super_PTypeBase.super_DObject._vptr_DObject);
          if (pFStack_30 == (FxGlobalVariable *)0x0) {
            if (this != (FxIdentifier *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,3,
                     "Self pointer used in ambiguous context; VM execution may abort!");
          *(undefined1 *)&sym[1].super_PTypeBase.super_DObject.GCNext = 1;
        }
        goto LAB_0076dfb1;
      }
    }
    pPVar1 = sym;
    if ((this->noglobal & 1U) != 0) {
      (this->super_FxExpression).ValueType = &TypeError->super_PType;
      return &this->super_FxExpression;
    }
    if (pFStack_30 == (FxGlobalVariable *)0x0) {
      FName::FName((FName *)((long)&cvar + 4),&this->Identifier);
      newex = (FxExpression *)
              FCompileContext::FindGlobal((FCompileContext *)pPVar1,(FName *)((long)&cvar + 4));
      if (newex != (FxExpression *)0x0) {
        bVar2 = DObject::IsKindOf((DObject *)newex,PSymbolConst::RegistrationInfo.MyClass);
        if (bVar2) {
          pcVar8 = FName::GetChars(&this->Identifier);
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,8,
                     "Resolving name \'%s\' as global constant\n",pcVar8);
          pFStack_30 = (FxGlobalVariable *)
                       FxConstant::MakeConstant
                                 ((PSymbol *)newex,&(this->super_FxExpression).ScriptPosition);
        }
        else {
          bVar2 = DObject::IsKindOf((DObject *)newex,PField::RegistrationInfo.MyClass);
          if (!bVar2) {
            pcVar8 = FName::GetChars(&this->Identifier);
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "Invalid global identifier \'%s\'\n",pcVar8);
            if (this != (FxIdentifier *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
          pFVar9 = &(this->super_FxExpression).ScriptPosition;
          pcVar8 = FName::GetChars(&this->Identifier);
          sVar12 = 8;
          FScriptPosition::Message(pFVar9,8,"Resolving name \'%s\' as global variable\n",pcVar8);
          pFVar10 = (FxGlobalVariable *)FxExpression::operator_new((FxExpression *)0x38,sVar12);
          FxGlobalVariable::FxGlobalVariable(pFVar10,(PField *)newex,pFVar9);
          pFStack_30 = pFVar10;
        }
        goto LAB_0076dfb1;
      }
    }
    if (pFStack_30 == (FxGlobalVariable *)0x0) {
      pcVar8 = FName::operator_cast_to_char_(&this->Identifier);
      local._4_4_ = P_FindLineSpecial(pcVar8,(int *)0x0,(int *)0x0);
      if (local._4_4_ != 0) {
        pFVar9 = &(this->super_FxExpression).ScriptPosition;
        pcVar8 = FName::GetChars(&this->Identifier);
        sVar12 = 8;
        FScriptPosition::Message
                  (pFVar9,8,"Resolving name \'%s\' as line special %d\n",pcVar8,(ulong)local._4_4_);
        pFVar10 = (FxGlobalVariable *)FxExpression::operator_new((FxExpression *)0x38,sVar12);
        FxConstant::FxConstant((FxConstant *)pFVar10,local._4_4_,pFVar9);
        pFStack_30 = pFVar10;
        goto LAB_0076dfb1;
      }
    }
    pcVar8 = FName::GetChars(&this->Identifier);
    sVar12 = 0;
    this_04 = FindCVar(pcVar8,(FBaseCVar **)0x0);
    if (this_04 == (FBaseCVar *)0x0) {
      pcVar8 = FName::GetChars(&this->Identifier);
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Unknown identifier \'%s\'",pcVar8);
      if (this != (FxIdentifier *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      return (FxExpression *)0x0;
    }
    uVar4 = FBaseCVar::GetFlags(this_04);
    if ((uVar4 & 2) != 0) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "Cannot access userinfo CVARs directly. Use GetCVar() instead.");
      if (this != (FxIdentifier *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      return (FxExpression *)0x0;
    }
    pFVar10 = (FxGlobalVariable *)FxExpression::operator_new((FxExpression *)0x30,sVar12);
    FxCVar::FxCVar((FxCVar *)pFVar10,this_04,&(this->super_FxExpression).ScriptPosition);
    pFStack_30 = pFVar10;
  }
  else {
    pFVar7 = (FxSelf *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pPVar11);
    FxSelf::FxSelf(pFVar7,&(this->super_FxExpression).ScriptPosition,false);
    local_90 = pFVar7;
    iVar3 = (*(pFVar7->super_FxExpression)._vptr_FxExpression[2])(pFVar7,sym);
    pPVar1 = sym;
    local_90 = (FxSelf *)CONCAT44(extraout_var_02,iVar3);
    pVVar6 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                       ((TArray<PFunction::Variant,_PFunction::Variant> *)
                        (*(long *)&(sym->super_PTypeBase).super_DObject.ObjectFlags + 0x28),0);
    classctx = pVVar6->SelfClass;
    pVVar6 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                       ((TArray<PFunction::Variant,_PFunction::Variant> *)
                        (*(long *)&(sym->super_PTypeBase).super_DObject.ObjectFlags + 0x28),0);
    pFStack_30 = (FxGlobalVariable *)
                 ResolveMember(this,(FCompileContext *)pPVar1,classctx,(FxExpression **)&local_90,
                               pVVar6->SelfClass);
    if (pFStack_30 == (FxGlobalVariable *)0x0) {
      if (this != (FxIdentifier *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      return (FxExpression *)0x0;
    }
  }
LAB_0076dfb1:
  if (this != (FxIdentifier *)0x0) {
    (*(this->super_FxExpression)._vptr_FxExpression[1])();
  }
  if (pFStack_30 == (FxGlobalVariable *)0x0) {
    local_180 = (FxExpression *)0x0;
  }
  else {
    iVar3 = (*(pFStack_30->super_FxExpression)._vptr_FxExpression[2])(pFStack_30,sym);
    local_180 = (FxExpression *)CONCAT44(extraout_var_04,iVar3);
  }
  return local_180;
}

Assistant:

FxExpression *FxIdentifier::Resolve(FCompileContext& ctx)
{
	PSymbol * sym;
	FxExpression *newex = nullptr;
	int num;
	
	CHECKRESOLVED();

	// Local variables have highest priority.
	FxLocalVariableDeclaration *local = ctx.FindLocalVariable(Identifier);
	if (local != nullptr)
	{
		if (local->ExprType == EFX_StaticArray)
		{
			auto x = new FxStaticArrayVariable(local, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
		else if (local->ValueType->GetRegType() != REGT_NIL)
		{
			auto x = new FxLocalVariable(local, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
		else
		{
			auto x = new FxStackVariable(local->ValueType, local->StackOffset, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
	}

	if (Identifier == NAME_Default)
	{
		if (ctx.Function->Variants[0].SelfClass == nullptr)
		{
			ScriptPosition.Message(MSG_ERROR, "Unable to access class defaults from static function");
			delete this;
			return nullptr;
		}
		if (!ctx.Function->Variants[0].SelfClass->IsKindOf(RUNTIME_CLASS(PClassActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "'Default' requires an actor type.");
			delete this;
			return nullptr;
		}

		FxExpression * x = new FxClassDefaults(new FxSelf(ScriptPosition), ScriptPosition);
		delete this;
		return x->Resolve(ctx);
	}

	// Ugh, the horror. Constants need to be taken from the owning class, but members from the self class to catch invalid accesses here...
	// see if the current class (if valid) defines something with this name.
	PSymbolTable *symtbl;

	// first check fields in self
	if ((sym = ctx.FindInSelfClass(Identifier, symtbl)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			FxExpression *self = new FxSelf(ScriptPosition);
			self = self->Resolve(ctx);
			newex = ResolveMember(ctx, ctx.Function->Variants[0].SelfClass, self, ctx.Function->Variants[0].SelfClass);
			ABORT(newex);
			goto foundit;
		}
	}

	// now check in the owning class.
	if (newex == nullptr && (sym = ctx.FindInClass(Identifier, symtbl)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
		{
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as class constant\n", Identifier.GetChars());
			newex = FxConstant::MakeConstant(sym, ScriptPosition);
			goto foundit;
		}
		// Do this check for ZScript as well, so that a clearer error message can be printed. MSG_OPTERROR will default to MSG_ERROR there.
		else if (ctx.Function->Variants[0].SelfClass != ctx.Class && sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			FxExpression *self = new FxSelf(ScriptPosition, true);
			self = self->Resolve(ctx);
			newex = ResolveMember(ctx, ctx.Class, self, ctx.Class);
			ABORT(newex);
			ScriptPosition.Message(MSG_OPTERROR, "Self pointer used in ambiguous context; VM execution may abort!");
			ctx.Unsafe = true;
			goto foundit;
		}
		else
		{
			if (sym->IsKindOf(RUNTIME_CLASS(PFunction)))
			{
				ScriptPosition.Message(MSG_ERROR, "Function '%s' used without ().\n", Identifier.GetChars());
			}
			else
			{
				ScriptPosition.Message(MSG_ERROR, "Invalid member identifier '%s'.\n", Identifier.GetChars());
			}
			delete this;
			return nullptr;
		}
	}

	if (noglobal)
	{
		// This is needed to properly resolve class names on the left side of the member access operator
		ValueType = TypeError;
		return this;
	}

	// now check the global identifiers.
	if (newex == nullptr && (sym = ctx.FindGlobal(Identifier)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
		{
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as global constant\n", Identifier.GetChars());
			newex = FxConstant::MakeConstant(sym, ScriptPosition);
			goto foundit;
		}
		else if (sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			// internally defined global variable
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as global variable\n", Identifier.GetChars());
			newex = new FxGlobalVariable(static_cast<PField *>(sym), ScriptPosition);
			goto foundit;
		}
		else
		{
			ScriptPosition.Message(MSG_ERROR, "Invalid global identifier '%s'\n", Identifier.GetChars());
			delete this;
			return nullptr;
		}
	}

	// and line specials
	if (newex == nullptr && (num = P_FindLineSpecial(Identifier, nullptr, nullptr)))
	{
		ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as line special %d\n", Identifier.GetChars(), num);
		newex = new FxConstant(num, ScriptPosition);
		goto foundit;
	}

	if (auto *cvar = FindCVar(Identifier.GetChars(), nullptr))
	{
		if (cvar->GetFlags() & CVAR_USERINFO)
		{
			ScriptPosition.Message(MSG_ERROR, "Cannot access userinfo CVARs directly. Use GetCVar() instead.");
			delete this;
			return nullptr;
		}
		newex = new FxCVar(cvar, ScriptPosition);
		goto foundit;
	}
	
	ScriptPosition.Message(MSG_ERROR, "Unknown identifier '%s'", Identifier.GetChars());
	delete this;
	return nullptr;

foundit:
	delete this;
	return newex? newex->Resolve(ctx) : nullptr;
}